

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Impl * __thiscall
mp::BasicExprFactory<std::allocator<char>_>::Allocate<mp::CallExpr>
          (BasicExprFactory<std::allocator<char>_> *this,Kind kind,int extra_bytes)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Impl *pIVar3;
  reference ppIVar4;
  int in_EDX;
  Kind in_ESI;
  vector<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  *in_RDI;
  Impl *impl;
  value_type *in_stack_ffffffffffffffc8;
  
  std::
  vector<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ::push_back(in_RDI,in_stack_ffffffffffffffc8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDX + 0x20;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pIVar3 = (Impl *)operator_new__(uVar2);
  (pIVar3->super_Impl).kind_ = in_ESI;
  ppIVar4 = std::
            vector<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
            ::back(in_RDI);
  *ppIVar4 = (value_type)pIVar3;
  return pIVar3;
}

Assistant:

typename ExprType::Impl *Allocate(expr::Kind kind, int extra_bytes = 0) {
    /// Call push_back first to make sure that the impl pointer doesn't leak
    /// if push_back throws an exception.
    exprs_.push_back(0);
    typedef typename ExprType::Impl Impl;
    /// The following cannot overflow.
    /// Using `~new` due to #174
    Impl *impl = (Impl*) new char* [sizeof(Impl) + extra_bytes];
    impl->kind_ = kind;
    exprs_.back() = impl;
    return impl;
  }